

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

void output_nbits(char *outfile,int bits,int n)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  
  lVar2 = noutchar;
  buffer2 = bits & output_nbits::mask[n] | buffer2 << ((byte)n & 0x1f);
  iVar3 = bits_to_go2 - n;
  bVar1 = bits_to_go2 < n;
  bits_to_go2 = iVar3;
  if (iVar3 == 0 || bVar1) {
    outfile[noutchar] = (char)(buffer2 >> (-(char)iVar3 & 0x1fU));
    if (lVar2 < noutmax) {
      noutchar = lVar2 + 1;
    }
    bits_to_go2 = iVar3 + 8;
  }
  bitcount = bitcount + n;
  return;
}

Assistant:

static void
output_nbits(char *outfile, int bits, int n)
{
    /* AND mask for the right-most n bits */
    static int mask[9] = {0, 1, 3, 7, 15, 31, 63, 127, 255};
	/*
	 * insert bits at end of buffer
	 */
	buffer2 <<= n;
/*	buffer2 |= ( bits & ((1<<n)-1) ); */
	buffer2 |= ( bits & (*(mask+n)) );
	bits_to_go2 -= n;
	if (bits_to_go2 <= 0) {
		/*
		 * buffer2 full, put out top 8 bits
		 */

	        outfile[noutchar] = ((buffer2>>(-bits_to_go2)) & 0xff);

		if (noutchar < noutmax) noutchar++;
		
		bits_to_go2 += 8;
	}
	bitcount += n;
}